

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

CTxDestination *
AddAndGetMultisigDestination
          (CTxDestination *__return_storage_ptr__,int required,
          vector<CPubKey,_std::allocator<CPubKey>_> *pubkeys,OutputType type,
          FlatSigningProvider *keystore,CScript *script_out)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  long lVar4;
  ulong uVar5;
  pointer pCVar6;
  UniValue *pUVar7;
  undefined4 in_register_00000034;
  FlatSigningProvider *args_1;
  vector<CPubKey,_std::allocator<CPubKey>_> *__range1;
  long in_FS_OFFSET;
  long local_68;
  int required_local;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  required_local = required;
  if (required < 1) {
    pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "a multisignature address must require at least one key to redeem",
               (allocator<char> *)&local_68);
    JSONRPCError(pUVar7,-8,&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    lVar4 = (long)(pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    uVar5 = lVar4 / 0x41;
    lVar4 = lVar4 % 0x41;
    if ((int)uVar5 < required) {
      pUVar7 = (UniValue *)
               __cxa_allocate_exception(0x58,CONCAT44(in_register_00000034,required),lVar4);
      local_68 = ((long)(pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                       super__Vector_impl_data._M_start) / 0x41;
      tinyformat::format<unsigned_long,int>
                (&local_58,
                 (tinyformat *)
                 "not enough keys supplied (got %u keys, but need at least %d to redeem)",
                 (char *)&local_68,(unsigned_long *)&required_local,(int *)keystore);
      JSONRPCError(pUVar7,-8,&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else if (uVar5 < 0x15) {
      args_1 = keystore;
      GetScriptForMultisig((CScript *)&local_58,required,pubkeys);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&script_out->super_CScriptBase,
                 (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58);
      pCVar6 = (pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (pCVar6 == (pubkeys->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          if (type != LEGACY) goto LAB_005b5b8c;
          break;
        }
        puVar3 = pCVar6->vch;
        pCVar6 = pCVar6 + 1;
      } while ((*puVar3 & 0xfe) == 2);
      type = LEGACY;
      if ((script_out->super_CScriptBase)._size < 0x226) {
LAB_005b5b8c:
        AddAndGetDestinationForScript(__return_storage_ptr__,keystore,script_out,type);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          return __return_storage_ptr__;
        }
      }
      else {
        pUVar7 = (UniValue *)__cxa_allocate_exception(0x58);
        uVar1 = (script_out->super_CScriptBase)._size;
        uVar2 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar2 = uVar1;
        }
        local_68 = CONCAT44(local_68._4_4_,uVar2);
        tinyformat::format<unsigned_int,unsigned_int>
                  (&local_58,(tinyformat *)"redeemScript exceeds size limit: %d > %d",
                   (char *)&local_68,&MAX_SCRIPT_ELEMENT_SIZE,(uint *)args_1);
        JSONRPCError(pUVar7,-8,&local_58);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
    }
    else {
      pUVar7 = (UniValue *)
               __cxa_allocate_exception(0x58,CONCAT44(in_register_00000034,required),lVar4);
      tinyformat::format<int>
                (&local_58,
                 "Number of keys involved in the multisignature address creation > %d\nReduce the number"
                 ,&MAX_PUBKEYS_PER_MULTISIG);
      JSONRPCError(pUVar7,-8,&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar7,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

CTxDestination AddAndGetMultisigDestination(const int required, const std::vector<CPubKey>& pubkeys, OutputType type, FlatSigningProvider& keystore, CScript& script_out)
{
    // Gather public keys
    if (required < 1) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "a multisignature address must require at least one key to redeem");
    }
    if ((int)pubkeys.size() < required) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("not enough keys supplied (got %u keys, but need at least %d to redeem)", pubkeys.size(), required));
    }
    if (pubkeys.size() > MAX_PUBKEYS_PER_MULTISIG) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Number of keys involved in the multisignature address creation > %d\nReduce the number", MAX_PUBKEYS_PER_MULTISIG));
    }

    script_out = GetScriptForMultisig(required, pubkeys);

    // Check if any keys are uncompressed. If so, the type is legacy
    for (const CPubKey& pk : pubkeys) {
        if (!pk.IsCompressed()) {
            type = OutputType::LEGACY;
            break;
        }
    }

    if (type == OutputType::LEGACY && script_out.size() > MAX_SCRIPT_ELEMENT_SIZE) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, (strprintf("redeemScript exceeds size limit: %d > %d", script_out.size(), MAX_SCRIPT_ELEMENT_SIZE)));
    }

    // Make the address
    CTxDestination dest = AddAndGetDestinationForScript(keystore, script_out, type);

    return dest;
}